

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Optional.h
# Opt level: O1

OptionalStorage<llvm::DWARFDebugNames::Entry,_false> * __thiscall
llvm::optional_detail::OptionalStorage<llvm::DWARFDebugNames::Entry,_false>::operator=
          (OptionalStorage<llvm::DWARFDebugNames::Entry,_false> *this,Entry *y)

{
  Abbrev *pAVar1;
  
  if (this->hasVal == true) {
    SmallVectorImpl<llvm::DWARFFormValue>::operator=
              (&(this->field_0).value.super_Entry.Values.super_SmallVectorImpl<llvm::DWARFFormValue>
               ,&(y->super_Entry).Values.super_SmallVectorImpl<llvm::DWARFFormValue>);
    pAVar1 = y->Abbr;
    (this->field_0).value.NameIdx = y->NameIdx;
    (this->field_0).value.Abbr = pAVar1;
  }
  else {
    (this->field_0).value.super_Entry._vptr_Entry = (_func_int **)&PTR___cxa_pure_virtual_01097f30;
    SmallVector<llvm::DWARFFormValue,_3U>::SmallVector
              (&(this->field_0).value.super_Entry.Values,&(y->super_Entry).Values);
    (this->field_0).value.super_Entry._vptr_Entry = (_func_int **)&PTR_getCUOffset_01097e30;
    pAVar1 = y->Abbr;
    (this->field_0).value.NameIdx = y->NameIdx;
    (this->field_0).value.Abbr = pAVar1;
    this->hasVal = true;
  }
  return this;
}

Assistant:

OptionalStorage &operator=(T &&y) {
    if (hasValue()) {
      value = std::move(y);
    } else {
      ::new ((void *)std::addressof(value)) T(std::move(y));
      hasVal = true;
    }
    return *this;
  }